

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NodeSetChoiceLevel_rec(Abc_Obj_t *pNode,int fMaximum)

{
  int iVar1;
  int b;
  Abc_Obj_t *pAVar2;
  int local_34;
  int LevelE;
  int Level;
  int Level2;
  int Level1;
  Abc_Obj_t *pTemp;
  int fMaximum_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    pAVar2 = Abc_ObjFanin0(pNode);
    iVar1 = Abc_NodeSetChoiceLevel_rec(pAVar2,fMaximum);
    pAVar2 = Abc_ObjFanin1(pNode);
    b = Abc_NodeSetChoiceLevel_rec(pAVar2,fMaximum);
    local_34 = Abc_MaxInt(iVar1,b);
    local_34 = local_34 + 1;
    if ((pNode->field_5).pData != (void *)0x0) {
      iVar1 = Abc_NodeSetChoiceLevel_rec((Abc_Obj_t *)(pNode->field_5).pData,fMaximum);
      if (fMaximum == 0) {
        local_34 = Abc_MinInt(local_34,iVar1);
      }
      else {
        local_34 = Abc_MaxInt(local_34,iVar1);
      }
      for (_Level2 = (pNode->field_5).pData; _Level2 != (void *)0x0;
          _Level2 = *(void **)((long)_Level2 + 0x38)) {
        *(long *)((long)_Level2 + 0x40) = (long)local_34;
      }
    }
    pNode->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)local_34;
    pNode_local._4_4_ = local_34;
  }
  else {
    pNode_local._4_4_ = (pNode->field_6).iTemp;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NodeSetChoiceLevel_rec( Abc_Obj_t * pNode, int fMaximum )
{
    Abc_Obj_t * pTemp;
    int Level1, Level2, Level, LevelE;
    // skip the visited node
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return (int)(ABC_PTRINT_T)pNode->pCopy;
    Abc_NodeSetTravIdCurrent( pNode );
    // compute levels of the children nodes
    Level1 = Abc_NodeSetChoiceLevel_rec( Abc_ObjFanin0(pNode), fMaximum );
    Level2 = Abc_NodeSetChoiceLevel_rec( Abc_ObjFanin1(pNode), fMaximum );
    Level  = 1 + Abc_MaxInt( Level1, Level2 );
    if ( pNode->pData )
    {
        LevelE = Abc_NodeSetChoiceLevel_rec( (Abc_Obj_t *)pNode->pData, fMaximum );
        if ( fMaximum )
            Level = Abc_MaxInt( Level, LevelE );
        else
            Level = Abc_MinInt( Level, LevelE );
        // set the level of all equivalent nodes to be the same minimum
        for ( pTemp = (Abc_Obj_t *)pNode->pData; pTemp; pTemp = (Abc_Obj_t *)pTemp->pData )
            pTemp->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)Level;
    }
    pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)Level;
    return Level;
}